

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O2

Ivy_Obj_t * Ivy_GraphToNetwork(Ivy_Man_t *p,Dec_Graph_t *pGraph)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  Ivy_Obj_t *pIVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *local_38;
  
  if (pGraph->fConst == 0) {
    uVar6 = (ulong)(uint)pGraph->nLeaves;
    uVar4 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar4 < (uint)pGraph->nLeaves) {
      pIVar3 = (Ivy_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pGraph->pNodes[uVar4].field_2.pFunc);
    }
    else {
      lVar5 = uVar6 * 0x18;
      local_38 = (undefined1 *)0x0;
      for (; (long)uVar6 < (long)pGraph->nSize; uVar6 = uVar6 + 1) {
        pDVar2 = pGraph->pNodes;
        local_38 = &(pDVar2->eEdge0).field_0x0 + lVar5;
        uVar4 = *(uint *)(&(pDVar2->eEdge0).field_0x0 + lVar5);
        uVar1 = *(uint *)(&(pDVar2->eEdge1).field_0x0 + lVar5);
        pIVar3 = Ivy_And(p,(Ivy_Obj_t *)
                           ((ulong)(uVar4 & 1) ^
                           (ulong)pDVar2[uVar4 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Ivy_Obj_t *)
                         ((ulong)(uVar1 & 1) ^ (ulong)pDVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Ivy_Obj_t **)((long)&pDVar2->field_2 + lVar5) = pIVar3;
        lVar5 = lVar5 + 0x18;
      }
      pIVar3 = (Ivy_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ *(ulong *)(local_38 + 8));
    }
  }
  else {
    pIVar3 = (Ivy_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)p->pConst1);
  }
  return pIVar3;
}

Assistant:

Ivy_Obj_t * Ivy_GraphToNetwork( Ivy_Man_t * p, Dec_Graph_t * pGraph )
{
    Ivy_Obj_t * pAnd0, * pAnd1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Ivy_NotCond( Ivy_ManConst1(p), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Ivy_And( p, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Ivy_NotCond( (Ivy_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}